

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_file.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  int local_4;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    local_4 = 1;
  }
  else {
    init_platform_specific();
    open_log_monospace();
    read_test();
    close_log(true);
    if (error != 0) {
      exit(1);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
   (void)argc;
   (void)argv;

   if (!al_init())
      return 1;
   init_platform_specific();
   open_log_monospace();

   read_test();

   close_log(true);

   if (error) {
      exit(EXIT_FAILURE);
   }

   return 0;
}